

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

uint32 __thiscall
Clasp::Asp::RuleTransform::Impl::transform
          (Impl *this,Atom_t head,weight_t bound,WeightLitSpan *wlits,Strategy s)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  pointer pWVar4;
  pointer plVar5;
  size_t sVar6;
  uint32 uVar7;
  WeightLit_t *pWVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  pair<Potassco::WeightLit_t_*,_long> pVar14;
  Atom_t local_5c;
  AtomSpan local_58;
  LitSpan local_48;
  
  this->bound_ = bound;
  local_58.first = (uint *)wlits->first;
  sVar6 = wlits->size;
  (this->agg_).ebo_.size = 0;
  bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
  insert_impl<unsigned_int,bk_lib::detail::Memcpy<Potassco::WeightLit_t>>
            ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)&this->agg_,
             (this->agg_).ebo_.buf,(uint)sVar6,(Memcpy<Potassco::WeightLit_t> *)&local_58);
  uVar3 = (this->agg_).ebo_.size;
  uVar10 = (ulong)uVar3;
  if ((uVar10 != 0) && (bVar13 = uVar10 == 1, uVar3 != 1)) {
    pWVar4 = (this->agg_).ebo_.buf;
    if (pWVar4[1].weight <= pWVar4->weight) {
      lVar9 = 0;
      do {
        bVar13 = uVar10 * 8 + -0x10 == lVar9;
        if (bVar13) goto LAB_0014a07e;
        piVar1 = (int *)((long)&pWVar4[2].weight + lVar9);
        piVar2 = (int *)((long)&pWVar4[1].weight + lVar9);
        lVar9 = lVar9 + 8;
      } while (*piVar1 <= *piVar2);
    }
    if (!(bool)(uVar10 == 0 | bVar13)) {
      pVar14 = std::get_temporary_buffer<Potassco::WeightLit_t>(uVar10 + 1 >> 1);
      pWVar8 = pVar14.first;
      if (pWVar8 == (WeightLit_t *)0x0) {
        std::
        __inplace_stable_sort<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::Asp::RuleTransform::Impl::CmpW>>
                  (pWVar4,pWVar4 + uVar10);
      }
      else {
        std::
        __stable_sort_adaptive<Potassco::WeightLit_t*,Potassco::WeightLit_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::Asp::RuleTransform::Impl::CmpW>>
                  (pWVar4,pWVar4 + uVar10,pWVar8);
      }
      operator_delete(pWVar8);
    }
  }
LAB_0014a07e:
  local_58.first = (uint *)0x0;
  bk_lib::pod_vector<long,_std::allocator<long>_>::resize
            (&this->sumR_,(this->agg_).ebo_.size,(long *)&local_58);
  uVar3 = (this->agg_).ebo_.size;
  uVar12 = (ulong)uVar3;
  pWVar4 = (this->agg_).ebo_.buf;
  plVar5 = (this->sumR_).ebo_.buf;
  lVar9 = 0;
  uVar10 = uVar12;
  do {
    bVar13 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    if (bVar13) {
      iVar11 = this->bound_;
      uVar7 = 0;
      if (iVar11 <= lVar9) {
        if (iVar11 < 1) {
          local_48.first = (pointer)0x0;
          local_48.size = 0;
        }
        else {
          pWVar4 = (this->agg_).ebo_.buf;
          if ((long)iVar11 <= lVar9 - pWVar4[uVar3 - 1].weight) {
            if ((s != strategy_no_aux) && ((s != strategy_default || (5 < lVar9)))) {
              uVar7 = transformSplit(this,head);
              return uVar7;
            }
            uVar7 = transformSelect(this,head);
            return uVar7;
          }
          (this->lits_).ebo_.size = 0;
          if (uVar12 != 0) {
            lVar9 = 0;
            do {
              local_58.first =
                   (uint *)CONCAT44(local_58.first._4_4_,*(undefined4 *)((long)&pWVar4->lit + lVar9)
                                   );
              bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                        (&this->lits_,(int *)&local_58);
              lVar9 = lVar9 + 8;
            } while (uVar12 << 3 != lVar9);
          }
          local_48.size = (size_t)(this->lits_).ebo_.size;
          local_48.first = (int *)local_48.size;
          if ((pointer)local_48.size != (pointer)0x0) {
            local_48.first = (this->lits_).ebo_.buf;
          }
        }
        local_58.first = &local_5c;
        local_58.size = (size_t)(head != 0);
        local_5c = head;
        uVar7 = addRule(this,(Head_t)0x0,&local_58,&local_48);
      }
      return uVar7;
    }
    iVar11 = pWVar4[uVar10].weight;
    if (this->bound_ < iVar11) {
      iVar11 = this->bound_;
    }
    pWVar4[uVar10].weight = iVar11;
    lVar9 = lVar9 + iVar11;
    plVar5[uVar10] = lVar9;
  } while ((-1 < iVar11) && (lVar9 < 0x80000000));
  Potassco::fail(-2,
                 "uint32 Clasp::Asp::RuleTransform::Impl::transform(Atom_t, weight_t, const Potassco::WeightLitSpan &, Strategy)"
                 ,0xb7,"agg_[i].weight >= 0 && sum <= ( 2147483647)","invalid weight rule",0);
}

Assistant:

uint32 RuleTransform::Impl::transform(Atom_t head, weight_t bound, const Potassco::WeightLitSpan& wlits, Strategy s) {
	bound_ = bound;
	agg_.assign(begin(wlits), end(wlits));
	if (!isSorted(agg_.begin(), agg_.end(), CmpW())) {
		std::stable_sort(agg_.begin(), agg_.end(), CmpW());
	}
	wsum_t sum = 0;
	sumR_.resize(agg_.size());
	for (WLitVec::size_type i = agg_.size(); i--;) {
		agg_[i].weight = std::min(agg_[i].weight, bound_);
		sumR_[i] = (sum += agg_[i].weight);
		POTASSCO_REQUIRE(agg_[i].weight >= 0 && sum <= CLASP_WEIGHT_T_MAX, "invalid weight rule");
	}
	if      (bound_ > sum) { return 0; }
	else if (bound_ <= 0)  { return addRule(head, Potassco::toSpan<Potassco::Lit_t>()); }
	else if ((sum - agg_.back().weight) < bound_) { // normal rule
		lits_.clear();
		for (WLitVec::const_iterator it = agg_.begin(), end = agg_.end(); it != end; ++it) {
			lits_.push_back(lit(*it));
		}
		return addRule(head, Potassco::toSpan(lits_));
	}
	else {
		return ((s == strategy_no_aux || (sum < 6 && s == strategy_default))
			? transformSelect(head)
			: transformSplit(head));
	}
}